

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callWithLongLongIntegerParameter_Test::testBody
          (TEST_MockExpectedCall_callWithLongLongIntegerParameter_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  undefined8 uVar2;
  uint uVar3;
  UtestShell *pUVar4;
  char *pcVar5;
  TestTerminator *pTVar6;
  cpputest_longlong cVar7;
  SimpleString local_a8;
  MockNamedValue local_98;
  SimpleString local_48 [2];
  undefined8 local_28;
  longlong value;
  SimpleString paramName;
  TEST_MockExpectedCall_callWithLongLongIntegerParameter_Test *this_local;
  
  paramName.bufferSize_ = (size_t)this;
  SimpleString::SimpleString((SimpleString *)&value,"paramName");
  local_28 = 0x309;
  MockExpectedCall::withParameter
            (&((this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call)->super_MockExpectedCall,
             (SimpleString *)&value,0x309);
  pUVar4 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x28])(local_48,pMVar1,&value);
  pcVar5 = SimpleString::asCharString(local_48);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[9])
            (pUVar4,"long long int",pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xfd,pTVar6);
  SimpleString::~SimpleString(local_48);
  pUVar4 = UtestShell::getCurrent();
  uVar2 = local_28;
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_98,pMVar1,&value);
  cVar7 = MockNamedValue::getLongLongIntValue(&local_98);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x10])
            (pUVar4,uVar2,cVar7,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xfe,pTVar6);
  MockNamedValue::~MockNamedValue(&local_98);
  pUVar4 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  uVar3 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x2a])(pMVar1,&value);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(uVar3 & 1),"CHECK","call->hasInputParameterWithName(paramName)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xff,pTVar6);
  pUVar4 = UtestShell::getCurrent();
  (*(((this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call)->super_MockExpectedCall).
    _vptr_MockExpectedCall[0x3c])(&local_a8);
  pcVar5 = SimpleString::asCharString(&local_a8);
  (*pUVar4->_vptr_UtestShell[0xc])
            (pUVar4,"funcName -> long long int paramName: <777 (0x309)>",pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x100);
  SimpleString::~SimpleString(&local_a8);
  SimpleString::~SimpleString((SimpleString *)&value);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithLongLongIntegerParameter)
{
    const SimpleString paramName = "paramName";
    long long value = 777;
    call->withParameter(paramName, value);
    STRCMP_EQUAL("long long int", call->getInputParameterType(paramName).asCharString());
    LONGLONGS_EQUAL(value, call->getInputParameter(paramName).getLongLongIntValue());
    CHECK(call->hasInputParameterWithName(paramName));
    STRCMP_CONTAINS("funcName -> long long int paramName: <777 (0x309)>", call->callToString().asCharString());
}